

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_diag_sse41_128_8.c
# Opt level: O3

void arr_store_si128(int *array,__m128i vWH,int32_t i,int32_t s1Len,int32_t j,int32_t s2Len)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  
  uVar1 = (ulong)(uint)s1Len;
  uVar3 = (uint)vWH[0];
  iVar2 = (int)vWH[1];
  if (((i < s1Len) && ((int)uVar3 < iVar2)) && (-1 < (int)(i | uVar3))) {
    array[(vWH[0] & 0xffffffffU) * uVar1 + (ulong)(uint)i] = (int)(char)((ulong)in_XMM0_Qb >> 0x38);
  }
  if (i <= s1Len && ((0 < i && -2 < (int)uVar3) && (int)(uVar3 + 1) < iVar2)) {
    array[(uVar3 + 1) * uVar1 + ((ulong)(uint)i - 1)] = (int)(char)((ulong)in_XMM0_Qb >> 0x30);
  }
  if (((int)(uVar3 + 2) < iVar2 && -3 < (int)uVar3) && ((int)(i - 2U) < s1Len && 1 < i)) {
    array[(uVar3 + 2) * uVar1 + (ulong)(i - 2U)] = (int)(char)((ulong)in_XMM0_Qb >> 0x28);
  }
  if (((int)(uVar3 + 3) < iVar2 && -4 < (int)uVar3) && ((int)(i - 3U) < s1Len && 2 < i)) {
    array[(uVar3 + 3) * uVar1 + (ulong)(i - 3U)] = (int)(char)((ulong)in_XMM0_Qb >> 0x20);
  }
  if (((int)(uVar3 + 4) < iVar2 && -5 < (int)uVar3) && ((int)(i - 4U) < s1Len && 3 < i)) {
    array[(uVar3 + 4) * uVar1 + (ulong)(i - 4U)] = (int)(char)((ulong)in_XMM0_Qb >> 0x18);
  }
  if (((int)(uVar3 + 5) < iVar2 && -6 < (int)uVar3) && ((int)(i - 5U) < s1Len && 4 < i)) {
    array[(uVar3 + 5) * uVar1 + (ulong)(i - 5U)] = (int)(char)((ulong)in_XMM0_Qb >> 0x10);
  }
  if (((int)(uVar3 + 6) < iVar2 && -7 < (int)uVar3) && ((int)(i - 6U) < s1Len && 5 < i)) {
    array[(uVar3 + 6) * uVar1 + (ulong)(i - 6U)] = (int)(char)((ulong)in_XMM0_Qb >> 8);
  }
  if (((int)(uVar3 + 7) < iVar2 && -8 < (int)uVar3) && ((int)(i - 7U) < s1Len && 6 < i)) {
    array[(uVar3 + 7) * uVar1 + (ulong)(i - 7U)] = (int)(char)in_XMM0_Qb;
  }
  if (((int)(uVar3 + 8) < iVar2 && -9 < (int)uVar3) && ((int)(i - 8U) < s1Len && 7 < i)) {
    array[(uVar3 + 8) * uVar1 + (ulong)(i - 8U)] = (int)(char)((ulong)in_XMM0_Qa >> 0x38);
  }
  if (((int)(uVar3 + 9) < iVar2 && -10 < (int)uVar3) && ((int)(i - 9U) < s1Len && 8 < i)) {
    array[(uVar3 + 9) * uVar1 + (ulong)(i - 9U)] = (int)(char)((ulong)in_XMM0_Qa >> 0x30);
  }
  if (((int)(uVar3 + 10) < iVar2 && -0xb < (int)uVar3) && ((int)(i - 10U) < s1Len && 9 < i)) {
    array[(uVar3 + 10) * uVar1 + (ulong)(i - 10U)] = (int)(char)((ulong)in_XMM0_Qa >> 0x28);
  }
  if (((int)(uVar3 + 0xb) < iVar2 && -0xc < (int)uVar3) && ((int)(i - 0xbU) < s1Len && 10 < i)) {
    array[(uVar3 + 0xb) * uVar1 + (ulong)(i - 0xbU)] = (int)(char)((ulong)in_XMM0_Qa >> 0x20);
  }
  if (((int)(uVar3 + 0xc) < iVar2 && -0xd < (int)uVar3) && ((int)(i - 0xcU) < s1Len && 0xb < i)) {
    array[(uVar3 + 0xc) * uVar1 + (ulong)(i - 0xcU)] = (int)(char)((ulong)in_XMM0_Qa >> 0x18);
  }
  if (((int)(uVar3 + 0xd) < iVar2 && -0xe < (int)uVar3) && ((int)(i - 0xdU) < s1Len && 0xc < i)) {
    array[(uVar3 + 0xd) * uVar1 + (ulong)(i - 0xdU)] = (int)(char)((ulong)in_XMM0_Qa >> 0x10);
  }
  if (((int)(uVar3 + 0xe) < iVar2 && -0xf < (int)uVar3) && ((int)(i - 0xeU) < s1Len && 0xd < i)) {
    array[(uVar3 + 0xe) * uVar1 + (ulong)(i - 0xeU)] = (int)(char)((ulong)in_XMM0_Qa >> 8);
  }
  if (((int)(uVar3 + 0xf) < iVar2 && -0x10 < (int)uVar3) && ((int)(i - 0xfU) < s1Len && 0xe < i)) {
    array[uVar1 * (uVar3 + 0xf) + (ulong)(i - 0xfU)] = (int)(char)in_XMM0_Qa;
  }
  return;
}

Assistant:

static inline void arr_store_si128(
        int *array,
        __m128i vWH,
        int32_t i,
        int32_t s1Len,
        int32_t j,
        int32_t s2Len)
{
    if (0 <= i+0 && i+0 < s1Len && 0 <= j-0 && j-0 < s2Len) {
        array[1LL*(i+0)*s2Len + (j-0)] = (int8_t)_mm_extract_epi8(vWH, 15);
    }
    if (0 <= i+1 && i+1 < s1Len && 0 <= j-1 && j-1 < s2Len) {
        array[1LL*(i+1)*s2Len + (j-1)] = (int8_t)_mm_extract_epi8(vWH, 14);
    }
    if (0 <= i+2 && i+2 < s1Len && 0 <= j-2 && j-2 < s2Len) {
        array[1LL*(i+2)*s2Len + (j-2)] = (int8_t)_mm_extract_epi8(vWH, 13);
    }
    if (0 <= i+3 && i+3 < s1Len && 0 <= j-3 && j-3 < s2Len) {
        array[1LL*(i+3)*s2Len + (j-3)] = (int8_t)_mm_extract_epi8(vWH, 12);
    }
    if (0 <= i+4 && i+4 < s1Len && 0 <= j-4 && j-4 < s2Len) {
        array[1LL*(i+4)*s2Len + (j-4)] = (int8_t)_mm_extract_epi8(vWH, 11);
    }
    if (0 <= i+5 && i+5 < s1Len && 0 <= j-5 && j-5 < s2Len) {
        array[1LL*(i+5)*s2Len + (j-5)] = (int8_t)_mm_extract_epi8(vWH, 10);
    }
    if (0 <= i+6 && i+6 < s1Len && 0 <= j-6 && j-6 < s2Len) {
        array[1LL*(i+6)*s2Len + (j-6)] = (int8_t)_mm_extract_epi8(vWH, 9);
    }
    if (0 <= i+7 && i+7 < s1Len && 0 <= j-7 && j-7 < s2Len) {
        array[1LL*(i+7)*s2Len + (j-7)] = (int8_t)_mm_extract_epi8(vWH, 8);
    }
    if (0 <= i+8 && i+8 < s1Len && 0 <= j-8 && j-8 < s2Len) {
        array[1LL*(i+8)*s2Len + (j-8)] = (int8_t)_mm_extract_epi8(vWH, 7);
    }
    if (0 <= i+9 && i+9 < s1Len && 0 <= j-9 && j-9 < s2Len) {
        array[1LL*(i+9)*s2Len + (j-9)] = (int8_t)_mm_extract_epi8(vWH, 6);
    }
    if (0 <= i+10 && i+10 < s1Len && 0 <= j-10 && j-10 < s2Len) {
        array[1LL*(i+10)*s2Len + (j-10)] = (int8_t)_mm_extract_epi8(vWH, 5);
    }
    if (0 <= i+11 && i+11 < s1Len && 0 <= j-11 && j-11 < s2Len) {
        array[1LL*(i+11)*s2Len + (j-11)] = (int8_t)_mm_extract_epi8(vWH, 4);
    }
    if (0 <= i+12 && i+12 < s1Len && 0 <= j-12 && j-12 < s2Len) {
        array[1LL*(i+12)*s2Len + (j-12)] = (int8_t)_mm_extract_epi8(vWH, 3);
    }
    if (0 <= i+13 && i+13 < s1Len && 0 <= j-13 && j-13 < s2Len) {
        array[1LL*(i+13)*s2Len + (j-13)] = (int8_t)_mm_extract_epi8(vWH, 2);
    }
    if (0 <= i+14 && i+14 < s1Len && 0 <= j-14 && j-14 < s2Len) {
        array[1LL*(i+14)*s2Len + (j-14)] = (int8_t)_mm_extract_epi8(vWH, 1);
    }
    if (0 <= i+15 && i+15 < s1Len && 0 <= j-15 && j-15 < s2Len) {
        array[1LL*(i+15)*s2Len + (j-15)] = (int8_t)_mm_extract_epi8(vWH, 0);
    }
}